

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O3

void __thiscall
deqp::sl::ShaderCase::ShaderCase
          (ShaderCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,ExpectResult expectResult,
          vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
          *valueBlocks,GLSLVersion targetVersion,char *vertexSource,char *fragmentSource)

{
  vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
  *this_00;
  string *outVertexSource;
  pointer valueBlock;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__ShaderCase_021165f0;
  this->m_renderCtx = renderCtx;
  this->m_expectResult = expectResult;
  this_00 = &this->m_valueBlocks;
  std::vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>::
  vector(this_00,valueBlocks);
  this->m_targetVersion = targetVersion;
  outVertexSource = &this->m_vertexSource;
  (this->m_vertexSource)._M_dataplus._M_p = (pointer)&(this->m_vertexSource).field_2;
  (this->m_vertexSource)._M_string_length = 0;
  (this->m_vertexSource).field_2._M_local_buf[0] = '\0';
  (this->m_fragmentSource)._M_dataplus._M_p = (pointer)&(this->m_fragmentSource).field_2;
  (this->m_fragmentSource)._M_string_length = 0;
  (this->m_fragmentSource).field_2._M_local_buf[0] = '\0';
  valueBlock = (this->m_valueBlocks).
               super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
               ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_valueBlocks).
      super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
      ._M_impl.super__Vector_impl_data._M_finish == valueBlock) {
    local_50._8_8_ = (pointer)0x0;
    aStack_40._M_allocated_capacity = 0;
    aStack_40._8_8_ = (pointer)0x0;
    local_50._0_4_ = 0;
    std::vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
    ::emplace_back<deqp::sl::ShaderCase::ValueBlock>(this_00,(ValueBlock *)local_50);
    std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>::~vector
              ((vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_> *)
               (local_50 + 8));
    valueBlock = (this_00->
                 super__Vector_base<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  }
  if (fragmentSource == (char *)0x0 || vertexSource == (char *)0x0) {
    if (vertexSource == (char *)0x0) {
      this->m_caseType = CASETYPE_FRAGMENT_ONLY;
      genVertexShader_abi_cxx11_((string *)local_50,this,valueBlock);
      std::__cxx11::string::operator=((string *)outVertexSource,(string *)local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_50._4_4_,local_50._0_4_) != &aStack_40) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_50._4_4_,local_50._0_4_),
                        (ulong)(aStack_40._M_allocated_capacity + 1));
      }
      specializeFragmentShader_abi_cxx11_((string *)local_50,this,fragmentSource,valueBlock);
    }
    else {
      this->m_caseType = CASETYPE_VERTEX_ONLY;
      specializeVertexShader_abi_cxx11_((string *)local_50,this,vertexSource,valueBlock);
      std::__cxx11::string::operator=((string *)outVertexSource,(string *)local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_50._4_4_,local_50._0_4_) != &aStack_40) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_50._4_4_,local_50._0_4_),
                        (ulong)(aStack_40._M_allocated_capacity + 1));
      }
      genFragmentShader_abi_cxx11_((string *)local_50,this,valueBlock);
    }
    std::__cxx11::string::operator=((string *)&this->m_fragmentSource,(string *)local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_50._4_4_,local_50._0_4_) != &aStack_40) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_50._4_4_,local_50._0_4_),
                      (ulong)(aStack_40._M_allocated_capacity + 1));
    }
  }
  else {
    this->m_caseType = CASETYPE_COMPLETE;
    specializeShaders(this,vertexSource,fragmentSource,outVertexSource,&this->m_fragmentSource,
                      valueBlock);
  }
  return;
}

Assistant:

ShaderCase::ShaderCase(tcu::TestContext& testCtx, RenderContext& renderCtx, const char* name, const char* description,
					   ExpectResult expectResult, const std::vector<ValueBlock>& valueBlocks, GLSLVersion targetVersion,
					   const char* vertexSource, const char* fragmentSource)
	: tcu::TestCase(testCtx, name, description)
	, m_renderCtx(renderCtx)
	, m_expectResult(expectResult)
	, m_valueBlocks(valueBlocks)
	, m_targetVersion(targetVersion)
{
	// If no value blocks given, use an empty one.
	if (m_valueBlocks.size() == 0)
		m_valueBlocks.push_back(ValueBlock());

	// Use first value block to specialize shaders.
	const ValueBlock& valueBlock = m_valueBlocks[0];

	// \todo [2010-04-01 petri] Check that all value blocks have matching values.

	// Generate specialized shader sources.
	if (vertexSource && fragmentSource)
	{
		m_caseType = CASETYPE_COMPLETE;
		specializeShaders(vertexSource, fragmentSource, m_vertexSource, m_fragmentSource, valueBlock);
	}
	else if (vertexSource)
	{
		m_caseType		 = CASETYPE_VERTEX_ONLY;
		m_vertexSource   = specializeVertexShader(vertexSource, valueBlock);
		m_fragmentSource = genFragmentShader(valueBlock);
	}
	else
	{
		DE_ASSERT(fragmentSource);
		m_caseType		 = CASETYPE_FRAGMENT_ONLY;
		m_vertexSource   = genVertexShader(valueBlock);
		m_fragmentSource = specializeFragmentShader(fragmentSource, valueBlock);
	}
}